

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

void write_segment_id(AV1_COMP *cpi,MACROBLOCKD *xd,MB_MODE_INFO *mbmi,aom_writer *w,
                     segmentation *seg,segmentation_probs *segp,int skip_txfm)

{
  CommonModeInfoParams *mi_params;
  _Bool _Var1;
  int mi_row;
  int mi_row_00;
  uint8_t *segment_ids;
  byte bVar2;
  uint ref;
  uint uVar3;
  ulong uVar4;
  BLOCK_SIZE bsize;
  int iVar5;
  uint uVar6;
  int mi_col;
  uint uVar7;
  
  if (seg->enabled == '\0') {
    return;
  }
  if (seg->update_map == '\0') {
    return;
  }
  iVar5 = 2 - (uint)(cpi->cyclic_refresh->skip_over4x4 == 0);
  mi_row = xd->mi_row;
  mi_row_00 = xd->mi_col;
  mi_params = &(cpi->common).mi_params;
  segment_ids = ((cpi->common).cur_frame)->seg_map;
  _Var1 = xd->left_available;
  mi_col = (int)segment_ids;
  if (xd->up_available == false) {
    uVar7 = 0xff;
    ref = 0xff;
    uVar6 = 0xff;
    if ((_Var1 & 1U) != 0) goto LAB_0018ad4e;
  }
  else {
    bsize = (BLOCK_SIZE)mi_row - (char)iVar5;
    uVar6 = 0xff;
    uVar7 = 0xff;
    if ((_Var1 & 1U) != 0) {
      bVar2 = get_segment_id(mi_params,segment_ids,bsize,mi_row_00 - iVar5,mi_col);
      uVar7 = (uint)bVar2;
    }
    bVar2 = get_segment_id(mi_params,segment_ids,bsize,mi_row_00,mi_col);
    ref = (uint)bVar2;
    if ((_Var1 & 1U) != 0) {
LAB_0018ad4e:
      bVar2 = get_segment_id(mi_params,segment_ids,(BLOCK_SIZE)mi_row,mi_row_00 - iVar5,mi_col);
      uVar6 = (uint)bVar2;
    }
    if (uVar7 != 0xff) {
      if ((uVar7 == ref) && (uVar7 == uVar6)) {
        uVar4 = 2;
        uVar3 = uVar7;
      }
      else {
        uVar4 = (ulong)((uVar6 == ref || uVar7 == uVar6) || uVar7 == ref);
        uVar3 = ref;
      }
      goto LAB_0018adb9;
    }
  }
  uVar7 = 0xff;
  uVar4 = 0;
  uVar3 = ref;
LAB_0018adb9:
  if ((char)ref == -1) {
    ref = 0;
    if (uVar6 != 0xff) {
      ref = uVar6;
    }
  }
  else if ((uVar6 != 0xff) && (ref = uVar6, uVar7 == uVar3)) {
    ref = uVar3;
  }
  if (skip_txfm != 0) {
    bVar2 = (byte)ref;
    set_spatial_segment_id(mi_params,segment_ids,mbmi->bsize,mi_row,mi_row_00,bVar2);
    set_spatial_segment_id(mi_params,(cpi->enc_seg).map,mbmi->bsize,mi_row,mi_row_00,bVar2);
    *(ushort *)&mbmi->field_0xa7 = *(ushort *)&mbmi->field_0xa7 & 0xfff8 | (ushort)(bVar2 & 7);
    return;
  }
  iVar5 = av1_neg_interleave(*(ushort *)&mbmi->field_0xa7 & 7,ref,seg->last_active_segid + 1);
  aom_write_symbol(w,iVar5,segp->spatial_pred_seg_cdf[uVar4],8);
  set_spatial_segment_id
            (mi_params,((cpi->common).cur_frame)->seg_map,mbmi->bsize,mi_row,mi_row_00,
             (byte)*(undefined2 *)&mbmi->field_0xa7 & 7);
  return;
}

Assistant:

static inline void write_segment_id(AV1_COMP *cpi, MACROBLOCKD *const xd,
                                    const MB_MODE_INFO *const mbmi,
                                    aom_writer *w,
                                    const struct segmentation *seg,
                                    struct segmentation_probs *segp,
                                    int skip_txfm) {
  if (!seg->enabled || !seg->update_map) return;

  AV1_COMMON *const cm = &cpi->common;
  int cdf_num;
  const uint8_t pred = av1_get_spatial_seg_pred(
      cm, xd, &cdf_num, cpi->cyclic_refresh->skip_over4x4);
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  if (skip_txfm) {
    // Still need to transmit tx size for intra blocks even if skip_txfm is
    // true. Changing segment_id may make the tx size become invalid, e.g
    // changing from lossless to lossy.
    assert(is_inter_block(mbmi) || !cpi->enc_seg.has_lossless_segment);

    set_spatial_segment_id(&cm->mi_params, cm->cur_frame->seg_map, mbmi->bsize,
                           mi_row, mi_col, pred);
    set_spatial_segment_id(&cm->mi_params, cpi->enc_seg.map, mbmi->bsize,
                           mi_row, mi_col, pred);
    /* mbmi is read only but we need to update segment_id */
    ((MB_MODE_INFO *)mbmi)->segment_id = pred;
    return;
  }

  const int coded_id =
      av1_neg_interleave(mbmi->segment_id, pred, seg->last_active_segid + 1);
  aom_cdf_prob *pred_cdf = segp->spatial_pred_seg_cdf[cdf_num];
  aom_write_symbol(w, coded_id, pred_cdf, MAX_SEGMENTS);
  set_spatial_segment_id(&cm->mi_params, cm->cur_frame->seg_map, mbmi->bsize,
                         mi_row, mi_col, mbmi->segment_id);
}